

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathErr(xmlXPathParserContextPtr ctxt,int code)

{
  xmlXPathContextPtr pxVar1;
  xmlXPathContextPtr pxVar2;
  bool bVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  void *data;
  xmlGenericErrorFunc channel;
  uint uVar8;
  xmlNodePtr node;
  xmlStructuredErrorFunc schannel;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  uVar8 = 0x1b;
  if ((uint)code < 0x1b) {
    uVar8 = code;
  }
  if (ctxt->error != 0) {
    return;
  }
  ctxt->error = uVar8;
  pxVar1 = ctxt->context;
  if (pxVar1 == (xmlXPathContextPtr)0x0) {
    data = (void *)0x0;
    node = (xmlNode *)0x0;
    schannel = (xmlStructuredErrorFunc)0x0;
    goto LAB_001bba59;
  }
  if ((pxVar1->lastError).code == 2) {
LAB_001bb9b9:
    data = (void *)0x0;
    node = (xmlNodePtr)0x0;
    schannel = (xmlStructuredErrorFunc)0x0;
    bVar3 = false;
  }
  else {
    xmlResetError(&pxVar1->lastError);
    (pxVar1->lastError).domain = 0xc;
    (pxVar1->lastError).code = uVar8 + 0x4b0;
    (pxVar1->lastError).level = XML_ERR_ERROR;
    if (ctxt->base != (xmlChar *)0x0) {
      pxVar5 = xmlStrdup(ctxt->base);
      (pxVar1->lastError).str1 = (char *)pxVar5;
      if (pxVar5 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
        goto LAB_001bb9b9;
      }
    }
    (pxVar1->lastError).int1 = *(int *)&ctxt->cur - *(int *)&ctxt->base;
    pxVar2 = ctxt->context;
    node = pxVar2->debugNode;
    (pxVar1->lastError).node = node;
    data = pxVar2->userData;
    schannel = pxVar2->error;
    bVar3 = true;
  }
  if (!bVar3) {
    return;
  }
LAB_001bba59:
  if (schannel == (xmlStructuredErrorFunc)0x0) {
    pp_Var6 = __xmlGenericError();
    channel = *pp_Var6;
    ppvVar7 = __xmlGenericErrorContext();
    data = *ppvVar7;
  }
  else {
    channel = (xmlGenericErrorFunc)0x0;
  }
  iVar4 = xmlRaiseError(schannel,channel,data,(void *)0x0,node,0xc,uVar8 + 0x4b0,XML_ERR_ERROR,
                        (char *)0x0,0,(char *)ctxt->base,(char *)0x0,(char *)0x0,
                        *(int *)&ctxt->cur - (int)ctxt->base,0,"%s",
                        xmlXPathErrorMessages_rel +
                        *(int *)(xmlXPathErrorMessages_rel + (ulong)uVar8 * 4));
  if (-1 < iVar4) {
    return;
  }
  xmlXPathPErrMemory(ctxt);
  return;
}

Assistant:

void
xmlXPathErr(xmlXPathParserContextPtr ctxt, int code)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;
    xmlNodePtr node = NULL;
    int res;

    if (ctxt == NULL)
        return;
    if ((code < 0) || (code > MAXERRNO))
	code = MAXERRNO;
    /* Only report the first error */
    if (ctxt->error != 0)
        return;

    ctxt->error = code;

    if (ctxt->context != NULL) {
        xmlErrorPtr err = &ctxt->context->lastError;

        /* Don't overwrite memory error. */
        if (err->code == XML_ERR_NO_MEMORY)
            return;

        /* cleanup current last error */
        xmlResetError(err);

        err->domain = XML_FROM_XPATH;
        err->code = code + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK;
        err->level = XML_ERR_ERROR;
        if (ctxt->base != NULL) {
            err->str1 = (char *) xmlStrdup(ctxt->base);
            if (err->str1 == NULL) {
                xmlXPathPErrMemory(ctxt);
                return;
            }
        }
        err->int1 = ctxt->cur - ctxt->base;
        err->node = ctxt->context->debugNode;

        schannel = ctxt->context->error;
        data = ctxt->context->userData;
        node = ctxt->context->debugNode;
    }

    if (schannel == NULL) {
        channel = xmlGenericError;
        data = xmlGenericErrorContext;
    }

    res = xmlRaiseError(schannel, channel, data, NULL, node, XML_FROM_XPATH,
                        code + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK,
                        XML_ERR_ERROR, NULL, 0,
                        (const char *) ctxt->base, NULL, NULL,
                        ctxt->cur - ctxt->base, 0,
                        "%s", xmlXPathErrorMessages[code]);
    if (res < 0)
        xmlXPathPErrMemory(ctxt);
}